

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipm.cc
# Opt level: O0

void __thiscall ipx::IPM::PrintOutput(IPM *this)

{
  bool bVar1;
  ostream *poVar2;
  ostream *poVar3;
  ostream *poVar4;
  Control *this_00;
  Basis *str;
  Basis *this_01;
  undefined8 *in_RDI;
  double dVar5;
  double density;
  Timer timer;
  Basis *basis;
  stringstream h_logging_stream;
  bool ipm_optimal;
  Iterate *in_stack_fffffffffffffa20;
  double in_stack_fffffffffffffa28;
  allocator *paVar6;
  Iterate *in_stack_fffffffffffffa40;
  Iterate *in_stack_fffffffffffffa50;
  Basis *in_stack_fffffffffffffa70;
  stringstream *in_stack_fffffffffffffb08;
  Control *in_stack_fffffffffffffb10;
  undefined8 in_stack_fffffffffffffba8;
  char *pcVar7;
  int width;
  bool local_422;
  allocator local_421;
  string local_420 [32];
  string local_400 [32];
  string local_3e0 [32];
  string local_3c0 [32];
  double local_3a0;
  string local_390 [32];
  Basis *local_370;
  string local_368 [32];
  string local_348 [32];
  string local_328 [32];
  string local_308 [32];
  string local_2e8 [32];
  string local_2c8 [32];
  string local_2a8 [32];
  string local_288 [32];
  string local_268 [32];
  string local_248 [32];
  string local_228 [32];
  string local_208 [32];
  string local_1e8 [48];
  string local_1b8 [32];
  stringstream local_198 [16];
  ostream local_188;
  bool local_9;
  
  bVar1 = Iterate::feasible(in_stack_fffffffffffffa40);
  local_422 = false;
  if (bVar1) {
    local_422 = Iterate::optimal(in_stack_fffffffffffffa50);
  }
  local_9 = local_422;
  std::__cxx11::stringstream::stringstream(local_198);
  std::__cxx11::string::string(local_1b8);
  std::__cxx11::stringstream::str((string *)local_198);
  std::__cxx11::string::~string(local_1b8);
  poVar2 = std::operator<<(&local_188," ");
  Format_abi_cxx11_((Int)((ulong)in_stack_fffffffffffffba8 >> 0x20),(int)in_stack_fffffffffffffba8);
  poVar3 = std::operator<<(poVar2,local_1e8);
  if ((local_9 & 1U) == 0) {
    pcVar7 = " ";
  }
  else {
    pcVar7 = "*";
  }
  poVar4 = std::operator<<(poVar3,pcVar7);
  width = (int)((ulong)poVar3 >> 0x20);
  poVar3 = std::operator<<(poVar4,"  ");
  Iterate::presidual(in_stack_fffffffffffffa20);
  Scientific_abi_cxx11_
            (in_stack_fffffffffffffa28,(int)((ulong)in_stack_fffffffffffffa20 >> 0x20),
             (int)in_stack_fffffffffffffa20);
  poVar3 = std::operator<<(poVar3,local_208);
  poVar3 = std::operator<<(poVar3," ");
  Iterate::dresidual(in_stack_fffffffffffffa20);
  Scientific_abi_cxx11_
            (in_stack_fffffffffffffa28,(int)((ulong)in_stack_fffffffffffffa20 >> 0x20),
             (int)in_stack_fffffffffffffa20);
  poVar3 = std::operator<<(poVar3,local_228);
  poVar3 = std::operator<<(poVar3,"  ");
  Iterate::pobjective_after_postproc(in_stack_fffffffffffffa20);
  Scientific_abi_cxx11_
            (in_stack_fffffffffffffa28,(int)((ulong)in_stack_fffffffffffffa20 >> 0x20),
             (int)in_stack_fffffffffffffa20);
  poVar3 = std::operator<<(poVar3,local_248);
  poVar3 = std::operator<<(poVar3," ");
  Iterate::dobjective_after_postproc(in_stack_fffffffffffffa20);
  Scientific_abi_cxx11_
            (in_stack_fffffffffffffa28,(int)((ulong)in_stack_fffffffffffffa20 >> 0x20),
             (int)in_stack_fffffffffffffa20);
  poVar3 = std::operator<<(poVar3,local_268);
  poVar3 = std::operator<<(poVar3,"  ");
  Iterate::mu(in_stack_fffffffffffffa20);
  Scientific_abi_cxx11_
            (in_stack_fffffffffffffa28,(int)((ulong)in_stack_fffffffffffffa20 >> 0x20),
             (int)in_stack_fffffffffffffa20);
  std::operator<<(poVar3,local_288);
  std::__cxx11::string::~string(local_288);
  std::__cxx11::string::~string(local_268);
  std::__cxx11::string::~string(local_248);
  std::__cxx11::string::~string(local_228);
  std::__cxx11::string::~string(local_208);
  std::__cxx11::string::~string(local_1e8);
  bVar1 = Control::timelessLog((Control *)*in_RDI);
  if (!bVar1) {
    poVar3 = std::operator<<(&local_188,"  ");
    Control::Elapsed((Control *)0x825e53);
    Fixed_abi_cxx11_(in_stack_fffffffffffffa28,(int)((ulong)in_stack_fffffffffffffa20 >> 0x20),
                     (int)in_stack_fffffffffffffa20);
    in_stack_fffffffffffffb10 = (Control *)std::operator<<(poVar3,local_2a8);
    std::operator<<((ostream *)in_stack_fffffffffffffb10,"s");
    std::__cxx11::string::~string(local_2a8);
  }
  Control::hLog(in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
  poVar3 = Control::Debug((Control *)*in_RDI,1);
  poVar3 = std::operator<<(poVar3,"  ");
  Fixed_abi_cxx11_(in_stack_fffffffffffffa28,(int)((ulong)in_stack_fffffffffffffa20 >> 0x20),
                   (int)in_stack_fffffffffffffa20);
  poVar3 = std::operator<<(poVar3,local_2c8);
  poVar3 = std::operator<<(poVar3," ");
  Fixed_abi_cxx11_(in_stack_fffffffffffffa28,(int)((ulong)in_stack_fffffffffffffa20 >> 0x20),
                   (int)in_stack_fffffffffffffa20);
  poVar3 = std::operator<<(poVar3,local_2e8);
  poVar3 = std::operator<<(poVar3,"  ");
  KKTSolver::basis_changes((KKTSolver *)0x826132);
  Format_abi_cxx11_((Int)((ulong)pcVar7 >> 0x20),(int)pcVar7);
  poVar3 = std::operator<<(poVar3,local_308);
  poVar3 = std::operator<<(poVar3," ");
  KKTSolver::iter((KKTSolver *)0x8261a4);
  Format_abi_cxx11_((Int)((ulong)pcVar7 >> 0x20),(int)pcVar7);
  std::operator<<(poVar3,local_328);
  std::__cxx11::string::~string(local_328);
  std::__cxx11::string::~string(local_308);
  std::__cxx11::string::~string(local_2e8);
  std::__cxx11::string::~string(local_2c8);
  poVar3 = Control::Debug((Control *)*in_RDI,1);
  poVar3 = std::operator<<(poVar3,"  ");
  Format_abi_cxx11_((Int)((ulong)pcVar7 >> 0x20),(int)pcVar7);
  poVar3 = std::operator<<(poVar3,local_348);
  this_00 = (Control *)std::operator<<(poVar3," ");
  Format_abi_cxx11_((Int)((ulong)pcVar7 >> 0x20),(int)pcVar7);
  std::operator<<((ostream *)this_00,local_368);
  std::__cxx11::string::~string(local_368);
  std::__cxx11::string::~string(local_348);
  str = KKTSolver::basis((KKTSolver *)0x826315);
  local_370 = str;
  if (str == (Basis *)0x0) {
    poVar3 = Control::Debug((Control *)*in_RDI,4);
    poVar3 = std::operator<<(poVar3,"  ");
    Format_abi_cxx11_((char *)poVar2,width);
    std::operator<<(poVar3,local_3e0);
    std::__cxx11::string::~string(local_3e0);
    poVar3 = Control::Debug((Control *)*in_RDI,4);
    poVar3 = std::operator<<(poVar3,"  ");
    Format_abi_cxx11_((char *)poVar2,width);
    std::operator<<(poVar3,local_400);
    std::__cxx11::string::~string(local_400);
  }
  else {
    poVar2 = Control::Debug((Control *)*in_RDI,4);
    bVar1 = std::ios::operator_cast_to_bool
                      ((_func_int *)
                       ((long)&poVar2->_vptr_basic_ostream + (long)poVar2->_vptr_basic_ostream[-3]))
    ;
    if (bVar1) {
      this_01 = (Basis *)Control::Debug((Control *)*in_RDI,4);
      poVar2 = std::operator<<((ostream *)this_01,"  ");
      Basis::MinSingularValue(in_stack_fffffffffffffa70);
      Scientific_abi_cxx11_
                (in_stack_fffffffffffffa28,(int)((ulong)in_stack_fffffffffffffa20 >> 0x20),
                 (int)in_stack_fffffffffffffa20);
      std::operator<<(poVar2,local_390);
      std::__cxx11::string::~string(local_390);
      Timer::Timer((Timer *)in_stack_fffffffffffffa20);
      local_3a0 = Basis::DensityInverse(this_01);
      dVar5 = Timer::Elapsed((Timer *)in_stack_fffffffffffffa20);
      *(double *)(in_RDI[3] + 0x198) = *(double *)(in_RDI[3] + 0x198) + dVar5;
      poVar2 = Control::Debug((Control *)*in_RDI,4);
      poVar2 = std::operator<<(poVar2,"  ");
      Scientific_abi_cxx11_
                (in_stack_fffffffffffffa28,(int)((ulong)in_stack_fffffffffffffa20 >> 0x20),
                 (int)in_stack_fffffffffffffa20);
      std::operator<<(poVar2,local_3c0);
      std::__cxx11::string::~string(local_3c0);
    }
  }
  paVar6 = &local_421;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_420,"\n",paVar6);
  Control::hLog(this_00,(string *)str);
  std::__cxx11::string::~string(local_420);
  std::allocator<char>::~allocator((allocator<char> *)&local_421);
  std::__cxx11::stringstream::~stringstream(local_198);
  return;
}

Assistant:

void IPM::PrintOutput() {
    const bool ipm_optimal = iterate_->feasible() && iterate_->optimal();

    if (kTerminationLogging) PrintHeader();
    std::stringstream h_logging_stream;
    h_logging_stream.str(std::string());
    h_logging_stream
      << " "  << Format(info_->iter, 3)
      << (ipm_optimal ? "*" : " ")
      << "  " << Scientific(iterate_->presidual(), 8, 2)
      << " "  << Scientific(iterate_->dresidual(), 8, 2)
      << "  " << Scientific(iterate_->pobjective_after_postproc(), 15, 8)
      << " "  << Scientific(iterate_->dobjective_after_postproc(), 15, 8)
      << "  " << Scientific(iterate_->mu(), 8, 2);
    if (!control_.timelessLog())
      h_logging_stream << "  " << Fixed(control_.Elapsed(), 6, 0) << "s";
    control_.hLog(h_logging_stream);
    control_.Debug()
      << "  " << Fixed(step_primal_, 4, 2) << " " << Fixed(step_dual_, 4, 2)
      << "  " << Format(kkt_->basis_changes(), 7)
      << " "  << Format(kkt_->iter(), 7);
    control_.Debug()
      << "  " << Format(info_->dual_dropped, 7)
      << " "  << Format(info_->primal_dropped, 7);

    const Basis* basis = kkt_->basis();
    if (basis) {
        if (control_.Debug(4)) {
            control_.Debug(4) << "  "
                              << Scientific(basis->MinSingularValue(), 9, 2);
            Timer timer;
            double density = basis->DensityInverse();
            info_->time_symb_invert += timer.Elapsed();
            control_.Debug(4) << "  " << Scientific(density, 8, 2);
        }
    } else {
        control_.Debug(4) << "  " << Format("-", 9);
        control_.Debug(4) << "  " << Format("-", 8);
    }
    control_.hLog("\n");
}